

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

XrResult ApiDumpLayerXrSuggestInteractionProfileBindings
                   (XrInstance instance,XrInteractionProfileSuggestedBinding *suggestedBindings)

{
  long lVar1;
  bool bVar2;
  XrResult XVar3;
  iterator iVar4;
  invalid_argument *this;
  XrGeneratedDispatchTable *gen_dispatch_table;
  allocator local_231;
  XrInstance instance_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  string local_1b8;
  ostringstream oss_instance;
  uint auStack_180 [88];
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instance_local = instance;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&oss_instance,&g_instance_dispatch_mutex);
  iVar4 = std::
          _Hashtable<XrInstance_T_*,_std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_instance_dispatch_map._M_h,&instance_local);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    gen_dispatch_table = (XrGeneratedDispatchTable *)0x0;
  }
  else {
    gen_dispatch_table =
         *(XrGeneratedDispatchTable **)
          ((long)iVar4.
                 super__Node_iterator_base<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_false>
                 ._M_cur + 0x10);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&oss_instance);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[36],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"XrResult",
               (char (*) [36])"xrSuggestInteractionProfileBindings",(char (*) [1])0x20fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_instance);
    lVar1 = *(long *)((long)&_oss_instance[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_180 + lVar1) = *(uint *)((long)auStack_180 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_instance);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[11],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [11])"XrInstance",(char (*) [9])"instance",&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::string((string *)&local_1b8,"suggestedBindings",(allocator *)&local_1f8);
    std::__cxx11::string::string
              ((string *)&local_1d8,"const XrInteractionProfileSuggestedBinding*",&local_231);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table,suggestedBindings,&local_1b8,&local_1d8,true,&contents);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (!bVar2) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_210,&contents);
    ApiDumpLayerRecordContent(&local_210);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_210);
    XVar3 = (*gen_dispatch_table->SuggestInteractionProfileBindings)
                      (instance_local,suggestedBindings);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_instance);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&contents);
  return XVar3;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrSuggestInteractionProfileBindings(
    XrInstance instance,
    const XrInteractionProfileSuggestedBinding* suggestedBindings) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_instance_dispatch_mutex);
            auto map_iter = g_instance_dispatch_map.find(instance);
            if (map_iter == g_instance_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrSuggestInteractionProfileBindings", "");
        std::ostringstream oss_instance;
        oss_instance << std::hex << reinterpret_cast<const void*>(instance);
        contents.emplace_back("XrInstance", "instance", oss_instance.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, suggestedBindings, "suggestedBindings", "const XrInteractionProfileSuggestedBinding*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->SuggestInteractionProfileBindings(instance, suggestedBindings);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}